

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

int __thiscall Assimp::CFIReaderImpl::getAttributeValueAsInt(CFIReaderImpl *this,char *name)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  Attribute *pAVar3;
  long lVar4;
  undefined4 extraout_var;
  
  pAVar3 = getAttributeByName(this,name);
  if (pAVar3 == (Attribute *)0x0) {
    return 0;
  }
  peVar1 = (pAVar3->value).super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 != (element_type *)0x0) &&
     (lVar4 = __dynamic_cast(peVar1,&FIValue::typeinfo,&FIIntValue::typeinfo,0), lVar4 != 0)) {
    this_00 = (pAVar3->value).super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar2 = 0;
    if (*(long *)(lVar4 + 0x10) - (long)*(int **)(lVar4 + 8) == 4) {
      iVar2 = **(int **)(lVar4 + 8);
    }
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return iVar2;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return iVar2;
  }
  iVar2 = (**peVar1->_vptr_FIValue)(peVar1);
  iVar2 = atoi(*(char **)CONCAT44(extraout_var,iVar2));
  return iVar2;
}

Assistant:

virtual int getAttributeValueAsInt(const char* name) const /*override*/ {
        const Attribute* attr = getAttributeByName(name);
        if (!attr) {
            return 0;
        }
        std::shared_ptr<const FIIntValue> intValue = std::dynamic_pointer_cast<const FIIntValue>(attr->value);
        if (intValue) {
            return intValue->value.size() == 1 ? intValue->value.front() : 0;
        }
        return atoi(attr->value->toString().c_str());
    }